

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtio.c
# Opt level: O1

uint32_t virtio_tx_batch(ixy_device *ixy,uint16_t queue_id,pkt_buf **bufs,uint32_t num_bufs)

{
  undefined8 *puVar1;
  size_t size;
  long lVar2;
  pkt_buf *ppVar3;
  long lVar4;
  short sVar5;
  uint uVar6;
  int iVar7;
  undefined8 in_RAX;
  ssize_t sVar8;
  void *pvVar9;
  uint *puVar10;
  mempool *pmVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  ushort uVar17;
  int __fd;
  long lVar18;
  dma_memory dVar19;
  ushort auStack_298 [256];
  ulong uStack_98;
  void *pvStack_90;
  ulong uStack_88;
  ushort uStack_7e;
  ushort uStack_7c;
  short sStack_7a;
  ulong uStack_78;
  void *pvStack_70;
  uintptr_t uStack_68;
  undefined4 uStack_5c;
  ulong uStack_58;
  uint *puStack_50;
  undefined8 uStack_28;
  
  uVar16 = (ulong)num_bufs;
  puVar10 = *(uint **)&ixy[1].num_rx_queues;
  uStack_28 = in_RAX;
  while( true ) {
    if ((ushort)puVar10[10] == *(ushort *)(*(long *)(puVar10 + 6) + 2)) break;
    lVar2 = *(long *)(puVar10 + 2);
    uVar13 = (ulong)*(uint *)(*(long *)(puVar10 + 6) + 4 +
                             ((ulong)(ushort)puVar10[10] % (ulong)*puVar10) * 8);
    lVar15 = uVar13 * 0x10;
    *(undefined8 *)(lVar2 + lVar15) = 0;
    *(undefined4 *)(lVar2 + 8 + lVar15) = 0;
    pkt_buf_free(*(pkt_buf **)(puVar10 + uVar13 * 2 + 0xe));
    *(short *)(puVar10 + 10) = (short)puVar10[10] + 1;
  }
  if (num_bufs == 0) {
    uVar16 = 0;
  }
  else {
    uVar13 = 0;
    uVar17 = 0;
    do {
      uVar6 = *puVar10;
      uVar14 = (uint)uVar17;
      if (uVar17 < uVar6) {
        lVar2 = *(long *)(*(long *)(puVar10 + 2) + (ulong)uVar17 * 0x10);
        while (lVar2 != 0) {
          uVar17 = uVar17 + 1;
          uVar14 = (uint)uVar17;
          if (uVar6 <= uVar17) break;
          lVar2 = *(long *)(*(long *)(puVar10 + 2) + (ulong)uVar17 * 0x10);
        }
      }
      if (uVar6 == uVar14) {
        uVar16 = uVar13 & 0xffffffff;
        break;
      }
      ppVar3 = bufs[uVar13];
      uVar6 = ppVar3->size;
      ixy[1].get_link_speed = ixy[1].get_link_speed + uVar6;
      ixy[1].read_stats = ixy[1].read_stats + 1;
      *(pkt_buf **)(puVar10 + (ulong)uVar17 * 2 + 0xe) = ppVar3;
      ppVar3->head_room[0x26] = '\0';
      ppVar3->head_room[0x27] = '\0';
      ppVar3->head_room[0x1e] = '\0';
      ppVar3->head_room[0x1f] = '\0';
      ppVar3->head_room[0x20] = '*';
      ppVar3->head_room[0x21] = '\0';
      ppVar3->head_room[0x22] = '\0';
      ppVar3->head_room[0x23] = '\0';
      ppVar3->head_room[0x24] = '\0';
      ppVar3->head_room[0x25] = '\0';
      lVar2 = *(long *)(puVar10 + 2);
      lVar15 = (ulong)uVar17 * 0x10;
      *(uint *)(lVar2 + 8 + lVar15) = uVar6 + 10;
      *(uintptr_t *)(lVar2 + lVar15) = ppVar3->buf_addr_phy + 0x36;
      *(undefined4 *)(lVar2 + 0xc + lVar15) = 0;
      *(ushort *)
       (*(long *)(puVar10 + 4) + 4 +
       ((ulong)((uint)*(ushort *)(*(long *)(puVar10 + 4) + 2) + (int)uVar13) % (ulong)*puVar10) * 2)
           = uVar17;
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar16);
  }
  *(short *)(*(long *)(puVar10 + 4) + 2) = *(short *)(*(long *)(puVar10 + 4) + 2) + (short)uVar16;
  uVar13 = (ulong)*(uint *)&ixy[1].pci_addr;
  pvVar9 = (void *)((long)&uStack_28 + 6);
  uStack_28 = CONCAT26(1,(undefined6)uStack_28);
  sVar8 = pwrite(*(uint *)&ixy[1].pci_addr,pvVar9,2,0x10);
  uVar6 = (uint)pvVar9;
  if (sVar8 == 2) {
    return (uint32_t)uVar16;
  }
  virtio_tx_batch_cold_1();
  sVar5 = (short)uVar6;
  uStack_58 = uVar16;
  puStack_50 = puVar10;
  if ((ushort)(sVar5 - 3U) < 0xfffe) {
    uStack_98 = 0x10705a;
    virtio_legacy_setup_tx_queue_cold_5();
    __fd = (int)uVar13;
LAB_0010705a:
    uStack_98 = 0x10705f;
    virtio_legacy_setup_tx_queue_cold_1();
LAB_0010705f:
    uStack_98 = 0x107064;
    virtio_legacy_setup_tx_queue_cold_2();
  }
  else {
    __fd = *(int *)(uVar13 + 0x70);
    uStack_98 = 0x106dd8;
    sStack_7a = sVar5;
    sVar8 = pwrite(__fd,&sStack_7a,2,0xe);
    uVar16 = uVar13;
    if (sVar8 != 2) goto LAB_0010705a;
    __fd = *(int *)(uVar13 + 0x70);
    uStack_98 = 0x106df9;
    sVar8 = pread(__fd,&uStack_7e,2,0xc);
    if (sVar8 != 2) goto LAB_0010705f;
    pvStack_90 = (void *)CONCAT44(pvStack_90._4_4_,(uint)uStack_7e);
    uStack_98 = 0x106e3d;
    uVar6 = fprintf(_stderr,"[DEBUG] %s:%d %s(): Max queue size of tx queue #%u: %u\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
                    ,0x37,"virtio_legacy_setup_tx_queue",(ulong)(uVar6 & 0xffff));
    uVar12 = (ulong)uVar6;
    uVar6 = (uint)uStack_7e;
    if (uStack_7e == 0) {
LAB_00106e42:
      return (uint32_t)uVar12;
    }
    uStack_78 = (ulong)uVar6;
    size = (ulong)(((uint)uStack_7e + (uint)uStack_7e * 8) * 2 + 0x1003 & 0x3ff000) + 4 +
           uStack_78 * 8;
    uStack_98 = 0x106e7b;
    dVar19 = memory_allocate_dma(size,true);
    uStack_68 = dVar19.phy;
    pvVar9 = dVar19.virt;
    uStack_98 = 0x106e93;
    memset(pvVar9,0xab,size);
    uStack_98 = 0x106ec4;
    pvStack_90 = pvVar9;
    pvStack_70 = pvVar9;
    fprintf(_stderr,"[DEBUG] %s:%d %s(): Allocated %zu bytes for virt queue at %p\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0x3e,"virtio_legacy_setup_tx_queue",size);
    __fd = *(int *)(uVar13 + 0x70);
    uStack_5c = (undefined4)(uStack_68 >> 0xc);
    uStack_98 = 0x106ee6;
    sVar8 = pwrite(__fd,&uStack_5c,4,8);
    if (sVar8 == 4) {
      uStack_98 = 0x106f02;
      puVar10 = (uint *)calloc(1,(ulong)uStack_7e * 8 + 0x38);
      *puVar10 = uVar6;
      *(void **)(puVar10 + 2) = pvStack_70;
      pvStack_90 = (void *)((ulong)(uint)((int)uStack_78 << 4) + (long)pvStack_70);
      *(void **)(puVar10 + 4) = pvStack_90;
      uStack_88 = (long)pvStack_90 + uStack_78 * 2 + 0x1003 & 0xfffffffffffff000;
      *(ulong *)(puVar10 + 6) = uStack_88;
      uStack_98 = 0x106f65;
      fprintf(_stderr,"[DEBUG] %s:%d %s(): vring desc: %p, vring avail: %p, vring used: %p\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
              ,0x44,"virtio_legacy_setup_tx_queue");
      uVar14 = *puVar10;
      if ((ulong)uVar14 != 0) {
        lVar2 = *(long *)(puVar10 + 2);
        lVar15 = *(long *)(puVar10 + 4);
        lVar4 = *(long *)(puVar10 + 6);
        lVar18 = 0;
        do {
          puVar1 = (undefined8 *)(lVar2 + lVar18 * 8);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined2 *)(lVar15 + 4 + lVar18) = 0;
          *(undefined8 *)(lVar4 + 4 + lVar18 * 4) = 0;
          lVar18 = lVar18 + 2;
        } while ((ulong)uVar14 * 2 != lVar18);
      }
      *(undefined2 *)(*(long *)(puVar10 + 6) + 2) = 0;
      *(undefined2 *)(*(long *)(puVar10 + 4) + 2) = 0;
      *(undefined2 *)(puVar10 + 10) = 0;
      __fd = *(int *)(uVar13 + 0x70);
      uStack_98 = 0x106fd5;
      sVar8 = pread(__fd,&uStack_7c,2,0x10);
      if (sVar8 == 2) {
        uStack_98 = 0x10700c;
        fprintf(_stderr,"[DEBUG] %s:%d %s(): vq notifcation offset %u\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
                ,0x54,"virtio_legacy_setup_tx_queue",(ulong)uStack_7c);
        *(ulong *)(puVar10 + 8) = (ulong)uStack_7c;
        if (sVar5 == 2) {
          uStack_98 = 0x107025;
          pmVar11 = memory_allocate_mempool(uVar6,0x800);
          *(mempool **)(puVar10 + 0xc) = pmVar11;
        }
        **(undefined2 **)(puVar10 + 4) = 1;
        **(undefined2 **)(puVar10 + 6) = 0;
        uVar12 = (ulong)(sVar5 != 1);
        *(uint **)(uVar13 + 0x80 + uVar12 * 8) = puVar10;
        goto LAB_00106e42;
      }
      goto LAB_00107069;
    }
  }
  uStack_98 = 0x107069;
  virtio_legacy_setup_tx_queue_cold_3();
LAB_00107069:
  uStack_98 = 0x10706e;
  virtio_legacy_setup_tx_queue_cold_4();
  uStack_98 = uVar16;
  iVar7 = ioctl(__fd,0x3b6c);
  if (iVar7 == -1) {
    vfio_enable_dma_cold_1();
  }
  else {
    auStack_298[0] = 0;
    sVar8 = pread(__fd,auStack_298,2,4);
    if (sVar8 == 2) {
      auStack_298[0] = auStack_298[0] | 4;
      sVar8 = pwrite(__fd,auStack_298,2,4);
      if (sVar8 == 2) {
        return 2;
      }
      __assert_fail("pwrite(device_fd, &dma, 2, conf_reg.offset + command_register_offset) == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c"
                    ,0x27,"void vfio_enable_dma(int)");
    }
  }
  __assert_fail("pread(device_fd, &dma, 2, conf_reg.offset + command_register_offset) == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c"
                ,0x25,"void vfio_enable_dma(int)");
}

Assistant:

uint32_t virtio_tx_batch(struct ixy_device* ixy, uint16_t queue_id, struct pkt_buf* bufs[], uint32_t num_bufs) {
	struct virtio_device* dev = IXY_TO_VIRTIO(ixy);
	struct virtqueue* vq = dev->tx_queue;

	_mm_mfence();
	// Free sent buffers
	while (vq->vq_used_last_idx != vq->vring.used->idx) {
		// info("We can free some buffers: %u != %u", vq->vq_used_last_idx,
		// vq->vring.used->idx);
		struct vring_used_elem* e = vq->vring.used->ring + (vq->vq_used_last_idx % vq->vring.num);
		// info("e %p, id %u", e, e->id);
		struct vring_desc* desc = &vq->vring.desc[e->id];
		desc->addr = 0;
		desc->len = 0;
		pkt_buf_free(vq->virtual_addresses[e->id]);
		vq->vq_used_last_idx++;
		_mm_mfence();
	}
	// Send buffers
	uint32_t buf_idx;
	uint16_t idx = 0; // Keep index of last found free descriptor and start searching from there
	for (buf_idx = 0; buf_idx < num_bufs; ++buf_idx) {
		struct pkt_buf* buf = bufs[buf_idx];
		// Find free desc index
		for (; idx < vq->vring.num; ++idx) {
			struct vring_desc* desc = &vq->vring.desc[idx];
			if (desc->addr == 0) {
				break;
			}
		}
		if (idx == vq->vring.num) {
			break;
		}
		// info("Found free desc slot at %u (%u)", idx, vq->vring.num);

		// Update tx counter
		dev->tx_bytes += buf->size;
		dev->tx_pkts++;

		vq->virtual_addresses[idx] = buf;

		// Copy header to headroom in front of data buffer
		memcpy(buf->head_room + sizeof(buf->head_room) - sizeof(net_hdr), &net_hdr, sizeof(net_hdr));

		vq->vring.desc[idx].len = buf->size + sizeof(net_hdr);
		vq->vring.desc[idx].addr =
			buf->buf_addr_phy + offsetof(struct pkt_buf, head_room) + sizeof(buf->head_room) - sizeof(net_hdr);
		vq->vring.desc[idx].flags = 0;
		vq->vring.desc[idx].next = 0;
		vq->vring.avail->ring[(vq->vring.avail->idx + buf_idx) % vq->vring.num] = idx;
	}
	_mm_mfence();
	vq->vring.avail->idx += buf_idx;
	_mm_mfence();
	virtio_legacy_notify_queue(dev, 1);
	return buf_idx;
}